

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error TT_Process_Composite_Component
                   (TT_Loader loader,FT_SubGlyph subglyph,FT_UInt start_point,
                   FT_UInt num_base_points)

{
  ushort uVar1;
  ushort uVar2;
  FT_GlyphLoader pFVar3;
  FT_Vector *pFVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  FT_Fixed FVar8;
  FT_Fixed FVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong yOffset;
  FT_SubGlyph matrix;
  long lVar14;
  undefined1 local_60 [8];
  FT_Outline current;
  
  pFVar3 = loader->gloader;
  current._0_8_ = (pFVar3->base).outline.points + num_base_points;
  local_60._2_2_ = (pFVar3->base).outline.n_points - (short)num_base_points;
  uVar1 = subglyph->flags;
  matrix = subglyph;
  current._32_8_ = loader;
  if ((uVar1 & 200) != 0) {
    matrix = (FT_SubGlyph)&subglyph->transform;
    FT_Outline_Transform((FT_Outline *)local_60,(FT_Matrix *)matrix);
  }
  uVar2 = subglyph->flags;
  yOffset = (ulong)uVar2;
  iVar11 = subglyph->arg1;
  iVar7 = subglyph->arg2;
  if ((uVar2 & 2) != 0) {
    if (iVar11 == 0 && iVar7 == 0) {
      return 0;
    }
    if ((uVar2 >> 0xb & 1) != 0 && (uVar1 & 200) != 0) {
      FVar8 = FT_Hypot((subglyph->transform).xx,(subglyph->transform).xy);
      FVar9 = FT_Hypot((subglyph->transform).yy,(subglyph->transform).yx);
      lVar12 = (long)(int)FVar8 * (long)iVar11;
      iVar11 = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      lVar12 = (long)(int)FVar9 * (long)iVar7;
      iVar7 = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
    }
    matrix = (FT_SubGlyph)(long)iVar11;
    yOffset = (ulong)iVar7;
    if ((*(ulong *)(current._32_8_ + 0x20) & 1) == 0) {
      lVar12 = *(long *)(*(long *)(current._32_8_ + 8) + 0x58);
      lVar14 = (long)*(int *)(lVar12 + 8) * (long)matrix;
      matrix = (FT_SubGlyph)(long)(int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10);
      lVar12 = (long)*(int *)(lVar12 + 0x10) * yOffset;
      yOffset = (ulong)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      if (((*(ulong *)(current._32_8_ + 0x20) & 2) == 0) && ((subglyph->flags & 4) != 0)) {
        if (*(int *)(*(long *)(*(long *)current._32_8_ + 0xb0) + 0x78) == 0x23) {
          matrix = (FT_SubGlyph)((ulong)&(matrix->transform).yx & 0xffffffffffffffc0);
        }
        yOffset = yOffset + 0x20 & 0xffffffffffffffc0;
      }
    }
    goto LAB_0022f6c1;
  }
  uVar10 = iVar11 + start_point;
  if (uVar10 < num_base_points) {
    uVar6 = iVar7 + num_base_points;
    uVar13 = (uint)(pFVar3->base).outline.n_points;
    yOffset = (ulong)uVar13;
    if (uVar13 <= uVar6) goto LAB_0022f6b5;
    pFVar4 = (pFVar3->base).outline.points;
    matrix = (FT_SubGlyph)(pFVar4[uVar10].x - pFVar4[uVar6].x);
    yOffset = pFVar4[uVar10].y - pFVar4[uVar6].y;
    bVar5 = true;
  }
  else {
LAB_0022f6b5:
    bVar5 = false;
  }
  if (!bVar5) {
    return 0x15;
  }
LAB_0022f6c1:
  if (matrix != (FT_SubGlyph)0x0 || yOffset != 0) {
    FT_Outline_Translate((FT_Outline *)local_60,(FT_Pos)matrix,yOffset);
  }
  return 0;
}

Assistant:

static FT_Error
  TT_Process_Composite_Component( TT_Loader    loader,
                                  FT_SubGlyph  subglyph,
                                  FT_UInt      start_point,
                                  FT_UInt      num_base_points )
  {
    FT_GlyphLoader  gloader = loader->gloader;
    FT_Outline      current;
    FT_Bool         have_scale;
    FT_Pos          x, y;


    current.points   = gloader->base.outline.points +
                         num_base_points;
    current.n_points = gloader->base.outline.n_points -
                         (short)num_base_points;

    have_scale = FT_BOOL( subglyph->flags & ( WE_HAVE_A_SCALE     |
                                              WE_HAVE_AN_XY_SCALE |
                                              WE_HAVE_A_2X2       ) );

    /* perform the transform required for this subglyph */
    if ( have_scale )
      FT_Outline_Transform( &current, &subglyph->transform );

    /* get offset */
    if ( !( subglyph->flags & ARGS_ARE_XY_VALUES ) )
    {
      FT_UInt     num_points = (FT_UInt)gloader->base.outline.n_points;
      FT_UInt     k = (FT_UInt)subglyph->arg1;
      FT_UInt     l = (FT_UInt)subglyph->arg2;
      FT_Vector*  p1;
      FT_Vector*  p2;


      /* match l-th point of the newly loaded component to the k-th point */
      /* of the previously loaded components.                             */

      /* change to the point numbers used by our outline */
      k += start_point;
      l += num_base_points;
      if ( k >= num_base_points ||
           l >= num_points      )
        return FT_THROW( Invalid_Composite );

      p1 = gloader->base.outline.points + k;
      p2 = gloader->base.outline.points + l;

      x = p1->x - p2->x;
      y = p1->y - p2->y;
    }
    else
    {
      x = subglyph->arg1;
      y = subglyph->arg2;

      if ( !x && !y )
        return FT_Err_Ok;

      /* Use a default value dependent on                                  */
      /* TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED.  This is useful for old */
      /* TT fonts which don't set the xxx_COMPONENT_OFFSET bit.            */

      if ( have_scale &&
#ifdef TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED
           !( subglyph->flags & UNSCALED_COMPONENT_OFFSET ) )
#else
            ( subglyph->flags & SCALED_COMPONENT_OFFSET ) )
#endif
      {

#if 0

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is what Apple documents.  But it doesn't work.   */
        /*                                                                 */
        int  a = subglyph->transform.xx > 0 ?  subglyph->transform.xx
                                            : -subglyph->transform.xx;
        int  b = subglyph->transform.yx > 0 ?  subglyph->transform.yx
                                            : -subglyph->transform.yx;
        int  c = subglyph->transform.xy > 0 ?  subglyph->transform.xy
                                            : -subglyph->transform.xy;
        int  d = subglyph->transform.yy > 0 ?  subglyph->transform.yy
                                            : -subglyph->transform.yy;
        int  m = a > b ? a : b;
        int  n = c > d ? c : d;


        if ( a - b <= 33 && a - b >= -33 )
          m *= 2;
        if ( c - d <= 33 && c - d >= -33 )
          n *= 2;
        x = FT_MulFix( x, m );
        y = FT_MulFix( y, n );

#else /* 1 */

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is a guess and works much better than the above. */
        /*                                                                 */
        FT_Fixed  mac_xscale = FT_Hypot( subglyph->transform.xx,
                                         subglyph->transform.xy );
        FT_Fixed  mac_yscale = FT_Hypot( subglyph->transform.yy,
                                         subglyph->transform.yx );


        x = FT_MulFix( x, mac_xscale );
        y = FT_MulFix( y, mac_yscale );

#endif /* 1 */

      }

      if ( !( loader->load_flags & FT_LOAD_NO_SCALE ) )
      {
        FT_Fixed  x_scale = loader->size->metrics->x_scale;
        FT_Fixed  y_scale = loader->size->metrics->y_scale;


        x = FT_MulFix( x, x_scale );
        y = FT_MulFix( y, y_scale );

        if ( subglyph->flags & ROUND_XY_TO_GRID )
        {
          TT_Face    face   = loader->face;
          TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );


          if ( IS_HINTED( loader->load_flags ) )
          {
            /*
             * We round the horizontal offset only if there is hinting along
             * the x axis; this corresponds to integer advance width values.
             *
             * Theoretically, a glyph's bytecode can toggle ClearType's
             * `backward compatibility' mode, which would allow modification
             * of the advance width.  In reality, however, applications
             * neither allow nor expect modified advance widths if sub-pixel
             * rendering is active.
             *
             */
            if ( driver->interpreter_version == TT_INTERPRETER_VERSION_35 )
              x = FT_PIX_ROUND( x );

            y = FT_PIX_ROUND( y );
          }
        }
      }
    }

    if ( x || y )
      FT_Outline_Translate( &current, x, y );

    return FT_Err_Ok;
  }